

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::anon_unknown_69::WindowFlowController::taskFailed
          (WindowFlowController *this,Exception *exception)

{
  Tag TVar1;
  PromiseFulfiller<void> *pPVar2;
  Exception *other;
  Exception *local_398;
  Exception *_kj_switch_done_1;
  Exception *exception_1;
  Exception local_1e0;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_50;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *fulfiller;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *__end4;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *__begin4;
  Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *__range4;
  Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *_kj_switch_done;
  Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *blockedSends;
  OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>
  *_kj_switch_subject;
  Exception *exception_local;
  WindowFlowController *this_local;
  
  _kj_switch_subject =
       (OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception> *)
       exception;
  exception_local = (Exception *)this;
  blockedSends = (Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                 kj::
                 OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>
                 ::_switchSubject(&this->state);
  TVar1 = kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>
          ::which((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>
                   *)blockedSends);
  if (TVar1 == _variant0) {
    __range4 = kj::
               OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>
               ::get<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>>
                         ((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>
                           *)blockedSends);
    _kj_switch_done = __range4;
    while (__range4 != (Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)0x0) {
      __begin4 = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)_kj_switch_done;
      __end4 = kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::begin
                         (_kj_switch_done);
      fulfiller = kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::end
                            ((Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                             __begin4);
      for (; __end4 != fulfiller; __end4 = __end4 + 1) {
        local_50 = __end4;
        pPVar2 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->(__end4);
        kj::cp<kj::Exception>(&local_1e0,(Exception *)_kj_switch_subject);
        (**(pPVar2->super_PromiseRejector)._vptr_PromiseRejector)(pPVar2,&local_1e0);
        kj::Exception::~Exception(&local_1e0);
      }
      other = kj::mv<kj::Exception>((Exception *)_kj_switch_subject);
      kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>::
      OneOf<kj::Exception,int>
                ((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>,kj::Exception>
                  *)&exception_1,other);
      kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>::
      operator=(&this->state,
                (OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>
                 *)&exception_1);
      kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>::
      ~OneOf((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>
              *)&exception_1);
      __range4 = (Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)0x0;
    }
  }
  else if (TVar1 == _variant1) {
    local_398 = kj::
                OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>
                ::get<kj::Exception>
                          ((OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>
                            *)blockedSends);
    while (local_398 != (Exception *)0x0) {
      local_398 = (Exception *)0x0;
    }
  }
  return;
}

Assistant:

void taskFailed(kj::Exception&& exception) override {
    KJ_SWITCH_ONEOF(state) {
      KJ_CASE_ONEOF(blockedSends, Running) {
        // Fail out all pending sends.
        for (auto& fulfiller: blockedSends) {
          fulfiller->reject(kj::cp(exception));
        }
        // Fail out all future sends.
        state = kj::mv(exception);
      }
      KJ_CASE_ONEOF(exception, kj::Exception) {
        // ignore redundant exception
      }
    }
  }